

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32i386.c
# Opt level: O1

void i386_readconv(GlobalVars *gv,LinkFile *lf)

{
  bool bVar1;
  char *pcVar2;
  ar_info ai;
  
  if (lf->type != '\b') {
    lf->objname = lf->filename;
    elf32_parse(gv,lf,(Elf32_Ehdr *)lf->data,i386_reloc_elf2vlink);
    return;
  }
  bVar1 = ar_init(&ai,(char *)lf->data,lf->length,lf->filename);
  if (bVar1 == 0) {
    ierror("i386_readconv(): archive %s corrupted since last access",lf->pathname);
  }
  else {
    bVar1 = ar_extract(&ai);
    if (bVar1 != 0) {
      do {
        pcVar2 = allocstring(ai.name);
        lf->objname = pcVar2;
        elf_check_ar_type(fff[lf->format],lf->pathname,ai.data,'\x01','\x01',1,1,3);
        elf32_parse(gv,lf,(Elf32_Ehdr *)ai.data,i386_reloc_elf2vlink);
        bVar1 = ar_extract(&ai);
      } while (bVar1 != 0);
    }
  }
  return;
}

Assistant:

static void i386_readconv(struct GlobalVars *gv,struct LinkFile *lf)
/* Read ELF-386 executable / object / shared obj. */
{
  if (lf->type == ID_LIBARCH) {
    struct ar_info ai;

    if (ar_init(&ai,(char *)lf->data,lf->length,lf->filename)) {
      while (ar_extract(&ai)) {
        lf->objname = allocstring(ai.name);
        elf_check_ar_type(fff[lf->format],lf->pathname,ai.data,
                          ELFCLASS32,ELFDATA2LSB,ELF_VER,1,EM_386);
        elf32_parse(gv,lf,(struct Elf32_Ehdr *)ai.data,i386_reloc_elf2vlink);
      }
    }
    else
      ierror("i386_readconv(): archive %s corrupted since last access",
             lf->pathname);
  }
  else {
    lf->objname = lf->filename;
    elf32_parse(gv,lf,(struct Elf32_Ehdr *)lf->data,i386_reloc_elf2vlink);
  }
}